

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

void roundup_tmp_buffer(FFSBuffer buf,int req_alignment)

{
  uint uVar1;
  void *pvVar2;
  size_t __n;
  
  uVar1 = req_alignment - (int)buf->tmp_buffer_size & req_alignment - 1U;
  if (uVar1 != 0) {
    __n = (size_t)(int)uVar1;
    pvVar2 = ffs_realloc(buf->tmp_buffer,buf->tmp_buffer_size + __n);
    buf->tmp_buffer = pvVar2;
    memset((void *)((long)pvVar2 + buf->tmp_buffer_size),0,__n);
    buf->tmp_buffer_size = buf->tmp_buffer_size + __n;
  }
  return;
}

Assistant:

void
roundup_tmp_buffer(FFSBuffer buf, int req_alignment)
{
    int pad = (req_alignment - buf->tmp_buffer_size) & (req_alignment -1);  /*  only works if req_align is power of two */
    switch (req_alignment) {
    case 1: case 2: case 4: case 8: case 16: break;
    default:
	assert(0);
    }
    if (pad) {
	buf->tmp_buffer = realloc(buf->tmp_buffer, buf->tmp_buffer_size + pad);
	memset((char*)buf->tmp_buffer + buf->tmp_buffer_size, 0, pad);
	buf->tmp_buffer_size += pad;
    }
}